

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O1

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>::Column>
::
construct<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>::Column_z2_settings*&>
          (Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>::Column>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *u,int *u_1,
          Column_z2_settings **u_2)

{
  pointer this_00;
  void *ret;
  
  this_00 = *(pointer *)this;
  if (this_00 == (pointer)0x0) {
    this_00 = (pointer)boost::pool<boost::default_user_allocator_malloc_free>::malloc_need_resize
                                 ((pool<boost::default_user_allocator_malloc_free> *)this);
  }
  else {
    *(Field_operators **)this = (this_00->super_Column).operators_;
  }
  if (this_00 != (pointer)0x0) {
    persistence_matrix::
    Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>
    ::Column::Column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((Column *)this_00,u,*u_1,*u_2);
    return this_00;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                ,0x33,
                "pointer Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST>>>::Column>::construct(U &&...) [T = Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST>>>::Column, U = <const std::vector<unsigned int> &, int &, Gudhi::persistence_matrix::Matrix<Column_compression_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST>>::Column_z2_settings *&>]"
               );
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }